

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Turtlebot.cpp
# Opt level: O0

void __thiscall
chrono::turtlebot::Turtlebot_Part::Turtlebot_Part
          (Turtlebot_Part *this,string *name,bool fixed,shared_ptr<chrono::ChMaterialSurface> *mat,
          ChSystem *system,ChVector<double> *body_pos,ChQuaternion<double> *body_rot,
          shared_ptr<chrono::ChBodyAuxRef> *chassis_body,bool collide)

{
  ChBodyAuxRef *__p;
  element_type *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [32];
  shared_ptr<chrono::ChBodyAuxRef> local_60 [2];
  byte local_39;
  ChVector<double> *pCStack_38;
  bool collide_local;
  ChVector<double> *body_pos_local;
  ChSystem *system_local;
  shared_ptr<chrono::ChMaterialSurface> *mat_local;
  string *psStack_18;
  bool fixed_local;
  string *name_local;
  Turtlebot_Part *this_local;
  
  local_39 = collide;
  this->_vptr_Turtlebot_Part = (_func_int **)&PTR__Turtlebot_Part_002ef398;
  pCStack_38 = body_pos;
  body_pos_local = (ChVector<double> *)system;
  system_local = (ChSystem *)mat;
  mat_local._7_1_ = fixed;
  psStack_18 = name;
  name_local = (string *)this;
  std::__cxx11::string::string((string *)&this->m_name);
  std::shared_ptr<chrono::ChBodyAuxRef>::shared_ptr(&this->m_body);
  std::shared_ptr<chrono::ChMaterialSurface>::shared_ptr(&this->m_mat);
  std::__cxx11::string::string((string *)&this->m_mesh_name);
  ChVector<double>::ChVector(&this->m_offset);
  ChColor::ChColor(&this->m_color);
  std::shared_ptr<chrono::ChBodyAuxRef>::shared_ptr(&this->m_chassis);
  ChVector<double>::ChVector(&this->m_pos);
  ChQuaternion<double>::ChQuaternion(&this->m_rot);
  __p = (ChBodyAuxRef *)(**(code **)((long)body_pos_local->m_data[0] + 0x188))();
  std::shared_ptr<chrono::ChBodyAuxRef>::shared_ptr<chrono::ChBodyAuxRef,void>(local_60,__p);
  std::shared_ptr<chrono::ChBodyAuxRef>::operator=(&this->m_body,local_60);
  std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr(local_60);
  this_00 = std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->m_body);
  std::operator+(local_80,(char *)psStack_18);
  ChObj::SetNameString((ChObj *)this_00,local_80);
  std::__cxx11::string::~string((string *)local_80);
  std::shared_ptr<chrono::ChBodyAuxRef>::operator=(&this->m_chassis,chassis_body);
  std::shared_ptr<chrono::ChMaterialSurface>::operator=(&this->m_mat,mat);
  ChVector<double>::operator=(&this->m_pos,pCStack_38);
  ChQuaternion<double>::operator=(&this->m_rot,body_rot);
  this->m_system = (ChSystem *)body_pos_local;
  this->m_collide = (bool)(local_39 & 1);
  this->m_fixed = (bool)(mat_local._7_1_ & 1);
  return;
}

Assistant:

Turtlebot_Part::Turtlebot_Part(const std::string& name,
                               bool fixed,
                               std::shared_ptr<ChMaterialSurface> mat,
                               ChSystem* system,
                               const ChVector<>& body_pos,
                               const ChQuaternion<>& body_rot,
                               std::shared_ptr<ChBodyAuxRef> chassis_body,
                               bool collide) {
    m_body = std::shared_ptr<ChBodyAuxRef>(system->NewBodyAuxRef());
    m_body->SetNameString(name + "_body");
    m_chassis = chassis_body;
    m_mat = mat;
    m_pos = body_pos;
    m_rot = body_rot;
    m_system = system;
    m_collide = collide;
    m_fixed = fixed;
}